

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O2

bool __thiscall
HDD::Copy(HDD *this,HDD *phSrc_,int64_t uSectors_,int64_t uSrcOffset_,int64_t uDstOffset_,
         int64_t uTotal_,char *pcszAction_)

{
  int64_t iVar1;
  int iVar2;
  int sectors_;
  int64_t uPos;
  long lVar3;
  MEMORY mem;
  char *local_80;
  char *local_78;
  HDD *local_70;
  int64_t local_68;
  MEMORY local_60;
  char *local_48;
  int64_t local_40;
  ulong local_38;
  
  local_60.size = this->sector_size << 0xb;
  local_60._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
  local_70 = this;
  local_68 = uSrcOffset_;
  local_40 = uDstOffset_;
  local_60.pb = AllocMem(local_60.size);
  if (uTotal_ == 0) {
    uTotal_ = uSectors_;
  }
  local_48 = "Copying";
  if (pcszAction_ != (char *)0x0) {
    local_48 = pcszAction_;
  }
  lVar3 = 0;
  local_38 = uTotal_;
  while( true ) {
    if (phSrc_ != (HDD *)0x0) {
      Seek(phSrc_,lVar3 + local_68);
    }
    iVar1 = local_40;
    Seek(local_70,lVar3 + local_40);
    if (uSectors_ <= lVar3) {
      lVar3 = uSectors_;
    }
    iVar2 = (int)uSectors_ - (int)lVar3;
    sectors_ = 0x800;
    if (iVar2 < 0x800) {
      sectors_ = iVar2;
    }
    local_78 = local_48;
    local_80 = (char *)CONCAT44(local_80._4_4_,(int)((ulong)((iVar1 + lVar3) * 100) / local_38));
    Message<char_const*,int>(msgStatus,"%s... %d%%",&local_78,(int *)&local_80);
    if (iVar2 == 0) break;
    if (phSrc_ != (HDD *)0x0) {
      iVar2 = Read(phSrc_,local_60.pb,sectors_,false);
      if (iVar2 != sectors_) {
        local_78 = (char *)(local_68 + lVar3 + (long)iVar2);
        local_80 = LastError();
        Message<long,char_const*>
                  (msgStatus,"Read error at sector %lu: %s",(long *)&local_78,&local_80);
        memset(local_60.pb + (long)iVar2 * (long)local_70->sector_size,0,(long)local_70->sector_size
              );
        sectors_ = iVar2 + 1;
      }
    }
    if (opt.byteswap != 0) {
      ByteSwap(local_60.pb,(long)sectors_ * (long)local_70->sector_size);
    }
    iVar2 = Write(local_70,local_60.pb,sectors_,false);
    if (iVar2 != sectors_) {
      local_78 = (char *)(iVar1 + lVar3 + (long)iVar2);
      local_80 = LastError();
      Message<long,char_const*>
                (msgStatus,"Write error at sector %lu: %s",(long *)&local_78,&local_80);
      sectors_ = iVar2 + 1;
    }
    lVar3 = lVar3 + sectors_;
  }
  MEMORY::~MEMORY(&local_60);
  return true;
}

Assistant:

bool HDD::Copy(HDD* phSrc_, int64_t uSectors_, int64_t uSrcOffset_/*=0*/, int64_t uDstOffset_/*=0*/, int64_t uTotal_/*=0*/, const char* pcszAction_)
{
    MEMORY mem(SECTOR_BLOCK * sector_size);

    if (!uTotal_) uTotal_ = uSectors_;

    for (int64_t uPos = 0;;)
    {
        // Sync source and destinations
        if (phSrc_) phSrc_->Seek(uSrcOffset_ + uPos);
        Seek(uDstOffset_ + uPos);

        // Determine how much to transfer in one go
        if (uPos > uSectors_) uPos = uSectors_;
        auto uBlock = std::min(static_cast<int>(uSectors_ - uPos), SECTOR_BLOCK);

        Message(msgStatus, "%s... %d%%", pcszAction_ ? pcszAction_ : "Copying",
            static_cast<int>((static_cast<uint64_t>(uDstOffset_ + uPos) * 100 / uTotal_)));

        if (!uBlock)
            break;

        // Read from source disk
        auto uRead = phSrc_ ? phSrc_->Read(mem, uBlock) : uBlock;
        if (uRead != uBlock)
        {
            Message(msgStatus, "Read error at sector %lu: %s", uSrcOffset_ + uPos + uRead, LastError());

            // Clear the bad block, but include it in the read data
            memset(mem + (uRead * sector_size), 0, sector_size);
            ++uRead;
        }

        // Forced byte-swapping?
        if (opt.byteswap)
            ByteSwap(mem, uRead * sector_size);

        // Write to target disk
        auto uWritten = Write(mem, uRead);
        if (uWritten != uRead)
        {
            Message(msgStatus, "Write error at sector %lu: %s", uDstOffset_ + uPos + uWritten, LastError());

            // Skip past the write error
            ++uWritten;
        }

        // Advance by the amount written
        uPos += uWritten;
    }

    return true;
}